

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * ByteCodeGenerator::GetParentFuncInfo(FuncInfo *child)

{
  code *pcVar1;
  bool bVar2;
  FuncInfo *pFVar3;
  undefined4 *puVar4;
  Scope *local_20;
  Scope *scope;
  FuncInfo *child_local;
  
  local_20 = FuncInfo::GetBodyScope(child);
  while( true ) {
    if (local_20 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x73e,"(0)","0");
      if (bVar2) {
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        return (FuncInfo *)0x0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pFVar3 = Scope::GetFunc(local_20);
    if (pFVar3 != child) break;
    local_20 = Scope::GetEnclosingScope(local_20);
  }
  pFVar3 = Scope::GetFunc(local_20);
  return pFVar3;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetParentFuncInfo(FuncInfo* child)
{
    for (Scope* scope = child->GetBodyScope(); scope; scope = scope->GetEnclosingScope())
    {
        if (scope->GetFunc() != child)
        {
            return scope->GetFunc();
        }
    }
    Assert(0);
    return nullptr;
}